

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

RowSetEntry * rowSetEntrySort(RowSetEntry *pIn)

{
  RowSetEntry *pRVar1;
  RowSetEntry *pRVar2;
  RowSetEntry *pRVar3;
  ulong uVar4;
  RowSetEntry **ppRVar5;
  long lVar6;
  long in_FS_OFFSET;
  RowSetEntry *local_178;
  long local_170 [39];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_178,0,0x140);
  pRVar3 = (RowSetEntry *)0x0;
  if (pIn != (RowSetEntry *)0x0) {
    pRVar3 = (RowSetEntry *)0x0;
    do {
      pRVar1 = pIn->pRight;
      pIn->pRight = (RowSetEntry *)0x0;
      ppRVar5 = &local_178;
      if (pRVar3 != (RowSetEntry *)0x0) {
        uVar4 = 1;
        ppRVar5 = &local_178;
        do {
          pIn = rowSetEntryMerge(pRVar3,pIn);
          *ppRVar5 = (RowSetEntry *)0x0;
          ppRVar5 = (RowSetEntry **)(local_170 + (uVar4 - 1));
          pRVar3 = *ppRVar5;
          uVar4 = (ulong)((int)uVar4 + 1);
        } while (pRVar3 != (RowSetEntry *)0x0);
      }
      *ppRVar5 = pIn;
      pRVar3 = local_178;
      pIn = pRVar1;
    } while (pRVar1 != (RowSetEntry *)0x0);
  }
  lVar6 = 1;
  do {
    pRVar1 = (RowSetEntry *)local_170[lVar6 + -1];
    pRVar2 = pRVar3;
    if ((pRVar1 != (RowSetEntry *)0x0) && (pRVar2 = pRVar1, pRVar3 != (RowSetEntry *)0x0)) {
      pRVar2 = rowSetEntryMerge(pRVar3,pRVar1);
    }
    lVar6 = lVar6 + 1;
    pRVar3 = pRVar2;
  } while (lVar6 != 0x28);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return pRVar2;
}

Assistant:

static struct RowSetEntry *rowSetEntrySort(struct RowSetEntry *pIn){
  unsigned int i;
  struct RowSetEntry *pNext, *aBucket[40];

  memset(aBucket, 0, sizeof(aBucket));
  while( pIn ){
    pNext = pIn->pRight;
    pIn->pRight = 0;
    for(i=0; aBucket[i]; i++){
      pIn = rowSetEntryMerge(aBucket[i], pIn);
      aBucket[i] = 0;
    }
    aBucket[i] = pIn;
    pIn = pNext;
  }
  pIn = aBucket[0];
  for(i=1; i<sizeof(aBucket)/sizeof(aBucket[0]); i++){
    if( aBucket[i]==0 ) continue;
    pIn = pIn ? rowSetEntryMerge(pIn, aBucket[i]) : aBucket[i];
  }
  return pIn;
}